

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_network.cpp
# Opt level: O0

size_t sensors_analytics::helpers::HeaderCallback
                 (void *data,size_t size,size_t nmemb,void *user_data)

{
  long lVar1;
  mapped_type *pmVar2;
  string local_c0 [8];
  string value;
  string local_a0 [8];
  string key;
  size_t separator;
  allocator local_59;
  string local_58 [8];
  string header;
  Response *r;
  void *user_data_local;
  size_t nmemb_local;
  size_t size_local;
  void *data_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,(char *)data,size * nmemb,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  lVar1 = std::__cxx11::string::find_first_of((char)local_58,0x3a);
  if (lVar1 == -1) {
    Trim((string *)local_58);
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)user_data + 0x28),(key_type *)local_58);
      std::__cxx11::string::operator=((string *)pmVar2,"present");
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_58);
    Trim(local_a0);
    std::__cxx11::string::substr((ulong)local_c0,(ulong)local_58);
    Trim(local_c0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)user_data + 0x28),local_a0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  data_local = (void *)(size * nmemb);
  std::__cxx11::string::~string(local_58);
  return (size_t)data_local;
}

Assistant:

size_t helpers::HeaderCallback(void *data, size_t size, size_t nmemb,
                               void *user_data) {
  Response *r;
  r = reinterpret_cast<Response *>(user_data);
  string header(reinterpret_cast<char *>(data), size * nmemb);
  size_t separator = header.find_first_of(':');
  if (string::npos == separator) {
    // roll with non seperated headers...
    Trim(header);
    if (0 == header.length()) {
      return (size * nmemb);  // blank line;
    }
    r->headers_[header] = "present";
  } else {
    string key = header.substr(0, separator);
    Trim(key);
    string value = header.substr(separator + 1);
    Trim(value);
    r->headers_[key] = value;
  }

  return (size * nmemb);
}